

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

void __thiscall
FMultiBlockLinesIterator::FMultiBlockLinesIterator
          (FMultiBlockLinesIterator *this,FPortalGroupArray *check,AActor *origin,double checkradius
          )

{
  sector_t *psVar1;
  double dVar2;
  double dVar3;
  short sVar4;
  
  this->checklist = check;
  (this->bbox).m_Box[3] = -3.4028234663852886e+38;
  (this->bbox).m_Box[0] = -3.4028234663852886e+38;
  (this->bbox).m_Box[2] = 3.4028234663852886e+38;
  (this->bbox).m_Box[1] = 3.4028234663852886e+38;
  dVar2 = (origin->__Pos).X;
  dVar3 = (origin->__Pos).Y;
  (this->checkpoint).Z = (origin->__Pos).Z;
  (this->checkpoint).X = dVar2;
  (this->checkpoint).Y = dVar3;
  if (check->inited == false) {
    P_CollectConnectedGroups
              (origin->Sector->PortalGroup,&this->checkpoint,(origin->__Pos).Z + origin->Height,
               checkradius,check);
  }
  if ((checkradius == -1.0) && (!NAN(checkradius))) {
    checkradius = origin->radius;
  }
  (this->checkpoint).Z = checkradius;
  psVar1 = origin->Sector;
  sVar4 = (short)psVar1->PortalGroup;
  this->basegroup = sVar4;
  this->startsector = psVar1;
  this->continueup = true;
  this->continuedown = true;
  this->portalflags = 0;
  this->index = -1;
  startIteratorForGroup(this,(int)sVar4);
  return;
}

Assistant:

FMultiBlockLinesIterator::FMultiBlockLinesIterator(FPortalGroupArray &check, AActor *origin, double checkradius)
	: checklist(check)
{
	checkpoint = origin->Pos();
	if (!check.inited) P_CollectConnectedGroups(origin->Sector->PortalGroup, checkpoint, origin->Top(), checkradius, checklist);
	checkpoint.Z = checkradius == -1? origin->radius : checkradius;
	basegroup = origin->Sector->PortalGroup;
	startsector = origin->Sector;
	Reset();
}